

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O0

void __thiscall DbCheckPostLower::CheckNestedHelperCalls(DbCheckPostLower *this)

{
  code *pcVar1;
  bool bVar2;
  IRKind IVar3;
  undefined4 *puVar4;
  LabelInstr *pLVar5;
  bool bVar6;
  bool local_41;
  Instr *local_38;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  bool isInHelperBlock;
  DbCheckPostLower *this_local;
  
  bVar6 = false;
  instrStop = (Instr *)0x0;
  local_38 = this->func->m_headInstr;
  do {
    if (local_38 == (Instr *)0x0) {
      return;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_next != local_38)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,399,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                         "Modifying instr list but not using EDITING iterator!");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    instrStop = local_38;
    IVar3 = IR::Instr::GetKind(local_38);
    local_41 = true;
    if (IVar3 != InstrKindLabel) {
      local_41 = IR::Instr::IsProfiledLabelInstr(local_38);
    }
    if (local_41 != false) {
      pLVar5 = IR::Instr::AsLabelInstr(local_38);
      bVar6 = ((byte)pLVar5->field_0x78 >> 1 & 1) != 0;
    }
    if (((bVar6) && (local_38->m_opcode == CALL)) &&
       (bVar2 = IR::Instr::HasLazyBailOut(local_38), bVar2)) {
      EnsureOnlyMovesToRegisterOpnd(this,local_38);
    }
    local_38 = local_38->m_next;
  } while( true );
}

Assistant:

void
DbCheckPostLower::CheckNestedHelperCalls()
{
    bool isInHelperBlock = false;
    FOREACH_INSTR_IN_FUNC(instr, this->func)
    {
        if (instr->IsLabelInstr())
        {
            isInHelperBlock = instr->AsLabelInstr()->isOpHelper;
        }

        if (!isInHelperBlock || instr->m_opcode != Js::OpCode::CALL || !instr->HasLazyBailOut())
        {
            continue;
        }

        this->EnsureOnlyMovesToRegisterOpnd(instr);

    } NEXT_INSTR_IN_FUNC;
}